

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O3

string * __thiscall
OpenMD::SectionParser::stripComments
          (string *__return_storage_ptr__,SectionParser *this,string *line)

{
  char cVar1;
  uint uVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar2 = (uint)line->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (uVar2 != 0) {
    bVar6 = false;
    uVar9 = 0;
    bVar5 = false;
    do {
      iVar7 = (int)uVar9;
      if (bVar6) {
        cVar1 = (line->_M_dataplus)._M_p[uVar9];
        bVar10 = (bool)(cVar1 == '\n' & bVar5);
        bVar4 = cVar1 != '\n';
        if ((cVar1 == '\n') || ((bool)(bVar5 ^ 1))) goto LAB_001fcd81;
LAB_001fcd43:
        pcVar3 = (line->_M_dataplus)._M_p;
        bVar4 = bVar6;
        bVar10 = true;
        if ((pcVar3[uVar9] == '*') && (bVar10 = pcVar3[uVar9 + 1] != '/', !bVar10)) {
          iVar7 = iVar7 + 1;
        }
      }
      else {
        if (bVar5) goto LAB_001fcd43;
        pcVar3 = (line->_M_dataplus)._M_p;
        cVar1 = pcVar3[uVar9];
        if (cVar1 == '/') {
          cVar1 = pcVar3[uVar9 + 1];
          iVar8 = iVar7 + 1;
          if (cVar1 == '*') {
            bVar10 = true;
            goto LAB_001fcdba;
          }
          if (cVar1 != '/') goto LAB_001fcda6;
          iVar7 = iVar8;
          bVar4 = true;
          bVar10 = false;
        }
        else if (cVar1 == '#') {
          iVar7 = iVar7 + 1;
          bVar4 = true;
          bVar10 = false;
        }
        else {
LAB_001fcda6:
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar10 = false;
          iVar8 = iVar7;
LAB_001fcdba:
          iVar7 = iVar8;
          bVar4 = false;
        }
      }
LAB_001fcd81:
      bVar5 = bVar10;
      bVar6 = bVar4;
      uVar9 = (ulong)(iVar7 + 1U);
    } while (iVar7 + 1U < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SectionParser::stripComments(const std::string& line) {
    unsigned int n = line.length();
    std::string res;

    // Flags to indicate that single line and multpile line comments
    // have started or not.
    bool s_cmt = false;
    bool m_cmt = false;

    // Traverse the line
    for (unsigned int i = 0; i < n; i++) {
      // If single line comment flag is on, then check for end of it
      if (s_cmt == true && line[i] == '\n') s_cmt = false;

      // If multiple line comment is on, then check for end of it
      else if (m_cmt == true && line[i] == '*' && line[i + 1] == '/')
        m_cmt = false, i++;

      // If this character is in a comment, ignore it
      else if (s_cmt || m_cmt)
        continue;

      // Check for beginning of comments and set the approproate flags
      else if ((line[i] == '/' && line[i + 1] == '/') || (line[i] == '#'))
        s_cmt = true, i++;
      else if (line[i] == '/' && line[i + 1] == '*')
        m_cmt = true, i++;

      // If current character is a non-comment character, append it to res
      else
        res += line[i];
    }
    return res;
  }